

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O0

void __thiscall correctness_ctor_limits_Test::TestBody(correctness_ctor_limits_Test *this)

{
  bool bVar1;
  int iVar2;
  char *message;
  AssertHelper local_c8;
  Message local_c0;
  int local_b4;
  big_integer local_b0;
  big_integer local_90;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  undefined1 local_50 [8];
  big_integer b;
  big_integer a;
  correctness_ctor_limits_Test *this_local;
  
  iVar2 = std::numeric_limits<int>::min();
  big_integer::big_integer((big_integer *)&b.sign,iVar2);
  iVar2 = std::numeric_limits<int>::max();
  big_integer::big_integer((big_integer *)local_50,iVar2);
  big_integer::big_integer(&local_b0,(big_integer *)&b.sign);
  operator+(&local_90,&local_b0,(big_integer *)local_50);
  local_b4 = -1;
  testing::internal::EqHelper<false>::Compare<big_integer,int>
            ((EqHelper<false> *)local_70,"a + b","-1",&local_90,&local_b4);
  big_integer::~big_integer(&local_90);
  big_integer::~big_integer(&local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/maxLundin[P]BigInteger/big_integer_testing.cpp"
               ,0x1a,message);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  big_integer::~big_integer((big_integer *)local_50);
  big_integer::~big_integer((big_integer *)&b.sign);
  return;
}

Assistant:

TEST(correctness, ctor_limits) {
    big_integer a = std::numeric_limits<int>::min();
    big_integer b = std::numeric_limits<int>::max();
    EXPECT_EQ(a + b, -1);
}